

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

bool __thiscall QLCDNumber::checkOverflow(QLCDNumber *this,double num)

{
  long in_FS_OFFSET;
  QLCDNumberPrivate *d;
  bool of;
  bool *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int base;
  byte bVar1;
  double num_00;
  
  num_00 = *(double *)(in_FS_OFFSET + 0x28);
  d_func((QLCDNumber *)0x5ba41b);
  base = CONCAT13(0xaa,(int3)in_stack_fffffffffffffff4);
  double2string(num_00,base,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  bVar1 = (byte)((uint)base >> 0x18);
  QString::~QString((QString *)0x5ba45e);
  if (*(double *)(in_FS_OFFSET + 0x28) == num_00) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QLCDNumber::checkOverflow(double num) const
{
    Q_D(const QLCDNumber);
    bool of;
    double2string(num, d->base, d->ndigits, &of);
    return of;
}